

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::TriageEdgeCircumcenterSign<double>
              (Vector3<double> *x0,Vector3<double> *x1,Vector3<double> *a,Vector3<double> *b,
              Vector3<double> *c,int abc_sign)

{
  int iVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double z_error;
  Vector3<double> z;
  double local_48;
  double local_40;
  double local_38;
  double dStack_30;
  
  GetCircumcenter<double>(a,b,c,&local_48);
  dVar6 = x0->c_[2] + x1->c_[2];
  dVar10 = x0->c_[1] - x1->c_[1];
  dVar2 = x0->c_[2] - x1->c_[2];
  dVar3 = x0->c_[0] - x1->c_[0];
  dVar8 = x0->c_[0] + x1->c_[0];
  dVar9 = x0->c_[1] + x1->c_[1];
  dVar7 = dVar10 * dVar6 - dVar9 * dVar2;
  dVar6 = dVar2 * dVar8 - dVar3 * dVar6;
  dVar3 = dVar3 * dVar9 - dVar10 * dVar8;
  dVar2 = (dVar3 * dStack_30 + local_40 * dVar7 + 0.0 + dVar6 * local_38) * (double)abc_sign;
  auVar4._0_8_ = dVar6 * dVar6 + dVar7 * dVar7;
  auVar4._8_8_ = local_38 * local_38 + local_40 * local_40;
  auVar5._8_8_ = dStack_30 * dStack_30 + auVar4._8_8_;
  auVar5._0_8_ = dVar3 * dVar3 + auVar4._0_8_;
  auVar5 = sqrtpd(auVar4,auVar5);
  dVar3 = auVar5._0_8_;
  dVar3 = (dVar3 * 3.3306690738754696e-16 +
          (dVar3 * 4.464101615137754 + 6.153480596427404e-15) * 1.1102230246251565e-16) *
          auVar5._8_8_ + local_48 * dVar3;
  iVar1 = 1;
  if (dVar2 <= dVar3) {
    iVar1 = -(uint)(dVar2 < -dVar3);
  }
  return iVar1;
}

Assistant:

int TriageEdgeCircumcenterSign(const Vector3<T>& x0, const Vector3<T>& x1,
                               const Vector3<T>& a, const Vector3<T>& b,
                               const Vector3<T>& c, int abc_sign) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Compute the circumcenter Z of triangle ABC, and then test which side of
  // edge X it lies on.
  T z_error;
  Vector3<T> z = GetCircumcenter(a, b, c, &z_error);
  Vector3<T> nx = (x0 - x1).CrossProd(x0 + x1);
  // If the sign of triangle ABC is negative, then we have computed -Z and the
  // result should be negated.
  T result = abc_sign * nx.DotProd(z);

  T z_len = z.Norm();
  T nx_len = nx.Norm();
  T nx_error = ((1 + 2 * sqrt(3)) * nx_len + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T result_error = ((3 * T_ERR * nx_len + nx_error) * z_len + z_error * nx_len);
  return (result > result_error) ? 1 : (result < -result_error) ? -1 : 0;
}